

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools.cpp
# Opt level: O1

MatrixXd * __thiscall
Tools::CalculateJacobian(MatrixXd *__return_storage_ptr__,Tools *this,VectorXd *x_state)

{
  double dVar1;
  double dVar2;
  long lVar3;
  double *pdVar4;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pCVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float __x;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_98;
  float local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  Scalar local_48;
  Scalar local_40;
  double local_38;
  double local_30;
  Scalar local_28;
  Scalar local_20;
  double local_18;
  
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_data = (double *)0x0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_rows = 0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_cols = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)__return_storage_ptr__,0xc,3,4);
  lVar3 = (x_state->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
  ;
  if ((((0 < lVar3) && (lVar3 != 1)) && (2 < lVar3)) && (lVar3 != 3)) {
    pdVar4 = (x_state->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
    fVar8 = (float)*pdVar4;
    fVar6 = (float)pdVar4[1];
    dVar1 = pdVar4[2];
    dVar2 = pdVar4[3];
    __x = fVar8 * fVar8 + fVar6 * fVar6;
    if (__x < 0.0) {
      fVar7 = sqrtf(__x);
    }
    else {
      fVar7 = SQRT(__x);
    }
    if (0.0001 <= ABS(__x)) {
      local_98.m_row = 0;
      local_98.m_col = 1;
      local_98.m_currentBlockRows = 1;
      *(__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
       m_storage.m_data = (double)(fVar8 / fVar7);
      local_98.m_xpr = __return_storage_ptr__;
      local_18 = (double)(fVar6 / fVar7);
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (&local_98,&local_18);
      local_20 = 0.0;
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar5,&local_20);
      local_28 = 0.0;
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar5,&local_28);
      local_78 = -fVar6;
      uStack_74 = 0x80000000;
      uStack_70 = 0x80000000;
      uStack_6c = 0x80000000;
      local_30 = (double)(local_78 / __x);
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar5,&local_30);
      local_38 = (double)(fVar8 / __x);
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar5,&local_38);
      local_40 = 0.0;
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar5,&local_40);
      local_48 = 0.0;
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar5,&local_48);
      local_50 = (double)((((float)dVar1 * fVar6 - (float)dVar2 * fVar8) * fVar6) / (__x * fVar7));
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar5,&local_50);
      local_58 = (double)((((float)dVar2 * fVar8 + local_78 * (float)dVar1) * fVar8) / (__x * fVar7)
                         );
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar5,&local_58);
      local_60 = (double)(fVar8 / fVar7);
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar5,&local_60);
      local_68 = (double)(fVar6 / fVar7);
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                (pCVar5,&local_68);
      if (((local_98.m_currentBlockRows + local_98.m_row !=
            ((local_98.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
            m_storage.m_rows) &&
          (((local_98.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
           m_storage.m_cols != 0)) ||
         (local_98.m_col !=
          ((local_98.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
          m_storage.m_cols)) {
        __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/jeremy-shannon[P]CarND-Extended-Kalman-Filter-Project/src/Eigen/src/Core/CommaInitializer.h"
                      ,0x6f,
                      "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, -1, -1>>::finished() [MatrixType = Eigen::Matrix<double, -1, -1>]"
                     );
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"CalculateJacobian () - Error - Division by Zero",0x2f);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
      std::ostream::put('p');
      std::ostream::flush();
    }
    return __return_storage_ptr__;
  }
  __assert_fail("index >= 0 && index < size()",
                "/workspace/llm4binary/github/license_c_cmakelists/jeremy-shannon[P]CarND-Extended-Kalman-Filter-Project/src/Eigen/src/Core/DenseCoeffsBase.h"
                ,0xad,
                "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
               );
}

Assistant:

MatrixXd Tools::CalculateJacobian(const VectorXd& x_state) {
  /**
  TODO:
    * Calculate a Jacobian here.
  */
  MatrixXd Hj(3, 4);
  //recover state parameters
  float px = x_state(0);
  float py = x_state(1);
  float vx = x_state(2);
  float vy = x_state(3);

  //pre-compute a set of terms to avoid repeated calculation
  float c1 = px*px + py*py;
  float c2 = sqrt(c1);
  float c3 = (c1*c2);

  //check division by zero
  if (fabs(c1) < 0.0001){
      std::cout << "CalculateJacobian () - Error - Division by Zero" << std::endl;
      return Hj;
  }

  //compute the Jacobian matrix
  Hj << (px / c2), (py / c2), 0, 0,
      -(py / c1), (px / c1), 0, 0,
      py*(vx*py - vy*px) / c3, px*(px*vy - py*vx) / c3, px / c2, py / c2;

  return Hj;
}